

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O2

source_t * deci::AssembleProgram(source_t *__return_storage_ptr__,istream *input)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  value_t *pvVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  binop_t<deci::sum_xclass_t> *pbVar6;
  undefined4 extraout_var_00;
  iterator iVar7;
  runtime_error *this;
  undefined4 uVar8;
  opcode_t oVar9;
  pointer pcVar10;
  double val;
  allocator local_109;
  string opcodeToken;
  string argToken;
  string labelToken;
  command_t local_98;
  string local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labels;
  
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  labels._M_h._M_buckets = &labels._M_h._M_single_bucket;
  labels._M_h._M_bucket_count = 1;
  labels._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  labels._M_h._M_element_count = 0;
  labels._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  labels._M_h._M_rehash_policy._M_next_resize = 0;
  labels._M_h._M_single_bucket = (__node_base_ptr)0x0;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
LAB_00107f68:
      pcVar1 = (__return_storage_ptr__->
               super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar10 = (__return_storage_ptr__->
                     super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
                     super__Vector_impl_data._M_start; pcVar10 != pcVar1; pcVar10 = pcVar10 + 1) {
        iVar3 = (*pcVar10->arg->_vptr_value_t[1])();
        if (iVar3 == 1) {
          iVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&labels._M_h,(key_type *)(pcVar10->arg + 1));
          if (iVar7.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
              ._M_cur != (__node_type *)0x0) {
            (*pcVar10->arg->_vptr_value_t[3])();
            number_t::number_t((number_t *)&labelToken,
                               (double)*(int *)((long)iVar7.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                  ._M_cur + 0x28));
            pvVar4 = number_t::Copy((number_t *)&labelToken);
            pcVar10->arg = pvVar4;
            number_t::~number_t((number_t *)&labelToken);
          }
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&labels._M_h);
      return __return_storage_ptr__;
    }
    opcodeToken._M_dataplus._M_p = (pointer)&opcodeToken.field_2;
    opcodeToken._M_string_length = 0;
    opcodeToken.field_2._M_local_buf[0] = '\0';
    std::operator>>(input,(string *)&opcodeToken);
    _Var2._M_p = opcodeToken._M_dataplus._M_p;
    if (opcodeToken._M_string_length == 0) {
      std::__cxx11::string::~string((string *)&opcodeToken);
      goto LAB_00107f68;
    }
    iVar3 = strcasecmp(opcodeToken._M_dataplus._M_p,"nop");
    if (iVar3 == 0) {
      oVar9 = OP_FIRST;
LAB_00107bc6:
      argToken._M_dataplus._M_p = (pointer)&argToken.field_2;
      argToken._M_string_length = 0;
      argToken.field_2._M_local_buf[0] = '\0';
      std::operator>>(input,(string *)&argToken);
      _Var2._M_p = argToken._M_dataplus._M_p;
      local_98.opcode = oVar9;
      if ((byte)(*argToken._M_dataplus._M_p - 0x30U) < 10) {
        val = atof(argToken._M_dataplus._M_p);
        number_t::number_t((number_t *)&labelToken,val);
        pvVar4 = number_t::Copy((number_t *)&labelToken);
        number_t::~number_t((number_t *)&labelToken);
      }
      else {
        iVar3 = strcasecmp(argToken._M_dataplus._M_p,"sum");
        if (iVar3 == 0) {
          pbVar6 = binop_t<deci::sum_xclass_t>::Instance();
        }
        else {
          iVar3 = strcasecmp(_Var2._M_p,"sub");
          if (iVar3 == 0) {
            pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::sub_xclass_t>::Instance();
          }
          else {
            iVar3 = strcasecmp(_Var2._M_p,"mul");
            if (iVar3 == 0) {
              pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::mul_xclass_t>::Instance();
            }
            else {
              iVar3 = strcasecmp(_Var2._M_p,"div");
              if (iVar3 == 0) {
                pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::div_xclass_t>::Instance();
              }
              else {
                iVar3 = strcasecmp(_Var2._M_p,"ls");
                if (iVar3 == 0) {
                  pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::ls_xclass_t>::Instance();
                }
                else {
                  iVar3 = strcasecmp(_Var2._M_p,"gr");
                  if (iVar3 == 0) {
                    pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::gr_xclass_t>::Instance();
                  }
                  else {
                    iVar3 = strcasecmp(_Var2._M_p,"le");
                    if (iVar3 == 0) {
                      pbVar6 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::le_xclass_t>::Instance()
                      ;
                    }
                    else {
                      iVar3 = strcasecmp(_Var2._M_p,"ge");
                      if (iVar3 == 0) {
                        pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                 binop_t<deci::ge_xclass_t>::Instance();
                      }
                      else {
                        iVar3 = strcasecmp(_Var2._M_p,"eq");
                        if (iVar3 == 0) {
                          pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                   binop_t<deci::eq_xclass_t>::Instance();
                        }
                        else {
                          iVar3 = strcasecmp(_Var2._M_p,"neq");
                          if (iVar3 == 0) {
                            pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                     binop_t<deci::neq_xclass_t>::Instance();
                          }
                          else {
                            iVar3 = strcasecmp(_Var2._M_p,"or");
                            if (iVar3 == 0) {
                              pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                       binop_t<deci::or_xclass_t>::Instance();
                            }
                            else {
                              iVar3 = strcasecmp(_Var2._M_p,"and");
                              if (iVar3 == 0) {
                                pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                         binop_t<deci::and_xclass_t>::Instance();
                              }
                              else {
                                iVar3 = strcasecmp(_Var2._M_p,"xor");
                                if (iVar3 == 0) {
                                  pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                           binop_t<deci::xor_xclass_t>::Instance();
                                }
                                else {
                                  iVar3 = strcasecmp(_Var2._M_p,"pow");
                                  if (iVar3 == 0) {
                                    pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                             binop_t<deci::pow_xclass_t>::Instance();
                                  }
                                  else {
                                    iVar3 = strcasecmp(_Var2._M_p,"mod");
                                    if (iVar3 == 0) {
                                      pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                               binop_t<deci::mod_xclass_t>::Instance();
                                    }
                                    else {
                                      iVar3 = strcasecmp(_Var2._M_p,"not");
                                      if (iVar3 == 0) {
                                        pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                                 unrop_t<deci::not_xclass_t>::Instance();
                                      }
                                      else {
                                        iVar3 = strcasecmp(_Var2._M_p,"neg");
                                        if (iVar3 == 0) {
                                          pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                                   unrop_t<deci::neg_xclass_t>::Instance();
                                        }
                                        else {
                                          iVar3 = strcasecmp(_Var2._M_p,"print");
                                          if (iVar3 != 0) {
                                            std::__cxx11::string::string
                                                      ((string *)&local_88,_Var2._M_p,&local_109);
                                            string_t::string_t((string_t *)&labelToken,&local_88);
                                            pvVar4 = string_t::Copy((string_t *)&labelToken);
                                            string_t::~string_t((string_t *)&labelToken);
                                            std::__cxx11::string::~string((string *)&local_88);
                                            goto LAB_00107f2f;
                                          }
                                          pbVar6 = (binop_t<deci::sum_xclass_t> *)
                                                   print_t::Instance();
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar3 = (*(pbVar6->super_function_t).super_value_t._vptr_value_t[2])(pbVar6);
        pvVar4 = (value_t *)CONCAT44(extraout_var_00,iVar3);
      }
LAB_00107f2f:
      local_98.arg = pvVar4;
      std::vector<deci::command_t,_std::allocator<deci::command_t>_>::emplace_back<deci::command_t>
                (__return_storage_ptr__,&local_98);
      std::__cxx11::string::~string((string *)&argToken);
    }
    else {
      iVar3 = strcasecmp(_Var2._M_p,"arg");
      oVar9 = OP_ARG;
      if (iVar3 == 0) goto LAB_00107bc6;
      iVar3 = strcasecmp(_Var2._M_p,"push");
      oVar9 = OP_PUSH;
      if (iVar3 == 0) goto LAB_00107bc6;
      iVar3 = strcasecmp(_Var2._M_p,"resl");
      uVar8 = 3;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(_Var2._M_p,"drop");
        oVar9 = OP_DROP;
        if (iVar3 != 0) {
          iVar3 = strcasecmp(_Var2._M_p,"call");
          oVar9 = OP_CALL;
          if (iVar3 != 0) {
            iVar3 = strcasecmp(_Var2._M_p,"ret");
            uVar8 = 6;
            if (iVar3 == 0) goto LAB_00107e18;
            iVar3 = strcasecmp(_Var2._M_p,"bin");
            oVar9 = OP_BIN;
            if (iVar3 != 0) {
              iVar3 = strcasecmp(_Var2._M_p,"rval");
              oVar9 = OP_RVAL;
              if (iVar3 != 0) {
                iVar3 = strcasecmp(_Var2._M_p,"set");
                oVar9 = OP_SET;
                if (iVar3 != 0) {
                  iVar3 = strcasecmp(_Var2._M_p,"unr");
                  oVar9 = OP_UNR;
                  if (iVar3 != 0) {
                    iVar3 = strcasecmp(_Var2._M_p,"jz");
                    oVar9 = OP_JZ;
                    if (iVar3 != 0) {
                      iVar3 = strcasecmp(_Var2._M_p,"jmp");
                      oVar9 = OP_JMP;
                      if (iVar3 != 0) {
                        iVar3 = strcasecmp(_Var2._M_p,":");
                        if (iVar3 == 0) {
                          labelToken._M_dataplus._M_p = (pointer)&labelToken.field_2;
                          labelToken._M_string_length = 0;
                          labelToken.field_2._M_local_buf[0] = '\0';
                          std::operator>>(input,(string *)&labelToken);
                          pcVar10 = (__return_storage_ptr__->
                                    super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                          pcVar1 = (__return_storage_ptr__->
                                   super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                          pmVar5 = std::__detail::
                                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                 *)&labels,(key_type *)&labelToken);
                          *pmVar5 = (mapped_type)((ulong)((long)pcVar1 - (long)pcVar10) >> 4);
                          std::__cxx11::string::~string((string *)&labelToken);
                          goto LAB_00107f51;
                        }
                        iVar3 = strcasecmp(_Var2._M_p,"jnz");
                        oVar9 = OP_JNZ;
                        if (iVar3 != 0) {
                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this,"Unknown opcode");
                          __cxa_throw(this,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_00107bc6;
      }
LAB_00107e18:
      labelToken._M_dataplus._M_p._0_4_ = uVar8;
      pvVar4 = nothing_t::Instance();
      iVar3 = (*pvVar4->_vptr_value_t[2])(pvVar4);
      labelToken._M_string_length = CONCAT44(extraout_var,iVar3);
      std::vector<deci::command_t,_std::allocator<deci::command_t>_>::emplace_back<deci::command_t>
                (__return_storage_ptr__,(command_t *)&labelToken);
    }
LAB_00107f51:
    std::__cxx11::string::~string((string *)&opcodeToken);
  } while( true );
}

Assistant:

program_t::source_t AssembleProgram(std::istream& input) {
    program_t::source_t result;
    std::unordered_map<std::string, int> labels;

    while(!input.eof()) {
      std::string opcodeToken;

      input >> opcodeToken;

      if (opcodeToken.size() == 0) {
        break;
      }

      opcode_t opcode = SelectOpcode(opcodeToken.c_str());
      switch (opcode) {
      case OP_UNDEFINED:
        throw std::runtime_error("Unknown opcode");
      case OP_RESULT:
      case OP_RETURN:
        result.push_back({ opcode, nothing_t::Instance().Copy() });
        break;
      case OP_LABEL:
        {
          std::string labelToken;
          input >> labelToken;
          labels[labelToken] = result.size();
          break;
        }
      default:
        {
          std::string argToken;
          input >> argToken;
          result.push_back({ opcode, SelectValue(argToken.c_str()) });
          break;
        }
      }
    }

    // Fix label pointers
    for (auto& item: result) {
      if (item.arg->Type() == value_t::STRING) {
        string_t& str = static_cast<string_t&>(*item.arg);
        auto it = labels.find(str.Value());
        if (it != labels.end()) {
          item.arg->Delete();
          item.arg = number_t(it->second).Copy();
        }
      }
    }

    return result;
  }